

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeOperations.cpp
# Opt level: O3

ModuleDeclaration * __thiscall
soul::SourceCodeOperations::createDecl
          (ModuleDeclaration *__return_storage_ptr__,SourceCodeOperations *this,ModuleBase *m)

{
  byte bVar1;
  SourceCodeText *pSVar2;
  pointer pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  UnicodeChar UVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Ptr o;
  UTF8Reader t;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  UTF8Reader local_b8;
  UTF8Reader local_b0;
  Ptr local_a8;
  UTF8Reader local_a0;
  _Alloc_hider local_98;
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  CodeLocation local_78;
  CodeLocation local_68;
  CodeLocation local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __return_storage_ptr__->module = m;
  __return_storage_ptr__->allocator = &this->allocator;
  (__return_storage_ptr__->startIncludingPreamble).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)0x0;
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->moduleKeyword).location.data = (char *)0x0;
  (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->openBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).valid = false;
  (__return_storage_ptr__->fileComment).isStarSlash = false;
  (__return_storage_ptr__->fileComment).isDoxygenStyle = false;
  (__return_storage_ptr__->fileComment).isReferringBackwards = false;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->fileComment).lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->fileComment).range.start.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.start.location.data = (char *)0x0;
  (__return_storage_ptr__->fileComment).range.end.sourceCode.object = (SourceCodeText *)0x0;
  (__return_storage_ptr__->fileComment).range.end.location.data = (char *)0x0;
  pSVar2 = (m->processorKeywordLocation).sourceCode.object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  (__return_storage_ptr__->moduleKeyword).sourceCode.object = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  pbVar3 = (pointer)(m->processorKeywordLocation).location.data;
  (__return_storage_ptr__->moduleKeyword).location.data = (char *)pbVar3;
  ModuleDeclaration::getType_abi_cxx11_((string *)local_d8,__return_storage_ptr__);
  uVar4 = local_d8._0_8_;
  local_98._M_p = (pointer)&__return_storage_ptr__->startIncludingPreamble;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_d8._0_8_;
  local_90 = pbVar3;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pbVar3;
  do {
    bVar1 = paVar9->_M_local_buf[0];
    if (bVar1 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar4 != &aStack_c8) {
        operator_delete((void *)uVar4,(ulong)(aStack_c8._M_allocated_capacity + 1));
      }
      pbVar3 = local_90;
      if (pSVar2 != (SourceCodeText *)0x0) {
        (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
      }
      local_58.location.data = (char *)local_90;
      local_58.sourceCode.object = pSVar2;
      SourceCodeUtilities::findStartOfPrecedingComment((SourceCodeUtilities *)local_d8,&local_58);
      uVar4 = local_d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        *(undefined8 *)local_98._M_p = local_d8._0_8_;
        local_d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d8._0_8_;
      }
      uVar6 = local_d8._8_8_;
      (__return_storage_ptr__->startIncludingPreamble).location.data = (char *)local_d8._8_8_;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar9);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.sourceCode.object);
      if (pSVar2 != (SourceCodeText *)0x0) {
        (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
      }
      local_68.location.data = (char *)pbVar3;
      local_68.sourceCode.object = pSVar2;
      SimpleTokeniser::findNext((SimpleTokeniser *)local_d8,&local_68,(TokenType)0x259fad);
      uVar5 = local_d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        (__return_storage_ptr__->openBrace).sourceCode.object = (SourceCodeText *)local_d8._0_8_;
        local_d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d8._0_8_;
      }
      uVar7 = local_d8._8_8_;
      (__return_storage_ptr__->openBrace).location.data = (char *)local_d8._8_8_;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar9);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.sourceCode.object);
      local_78.sourceCode.object = (SourceCodeText *)uVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar5 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        *(int *)uVar5 = *(int *)uVar5 + 1;
      }
      local_78.location.data = (char *)uVar7;
      SimpleTokeniser::findEndOfMatchingDelimiter
                ((SimpleTokeniser *)local_d8,&local_78,(TokenType)0x259fad,(TokenType)0x258ac2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
      }
      else {
        (__return_storage_ptr__->endOfClosingBrace).sourceCode.object =
             (SourceCodeText *)local_d8._0_8_;
        local_d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d8._0_8_;
      }
      (__return_storage_ptr__->endOfClosingBrace).location.data = (char *)local_d8._8_8_;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)paVar9);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_78.sourceCode.object);
      local_88._0_8_ = uVar4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar4 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        *(int *)uVar4 = *(int *)uVar4 + 1;
      }
      local_88._8_8_ = uVar6;
      SourceCodeUtilities::parseComment((Comment *)local_d8,(CodeLocation *)&local_88);
      uVar4 = local_d8._0_8_;
      (__return_storage_ptr__->fileComment).valid = (bool)local_d8[0];
      (__return_storage_ptr__->fileComment).isStarSlash = (bool)local_d8[1];
      (__return_storage_ptr__->fileComment).isDoxygenStyle = (bool)local_d8[2];
      (__return_storage_ptr__->fileComment).isReferringBackwards = (bool)local_d8[3];
      (__return_storage_ptr__->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._8_8_;
      (__return_storage_ptr__->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_c8._M_allocated_capacity;
      (__return_storage_ptr__->fileComment).lines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_c8._8_8_;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._8_8_ = (SourceCodeText *)0x0;
      aStack_c8._M_allocated_capacity = 0;
      aStack_c8._8_8_ = 0;
      local_d8._0_8_ = uVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      if ((SourceCodeText *)local_b8.data != (SourceCodeText *)0x0) {
        (__return_storage_ptr__->fileComment).range.start.sourceCode.object =
             (SourceCodeText *)local_b8.data;
        local_b8.data = (char *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
      }
      (__return_storage_ptr__->fileComment).range.start.location.data = local_b0.data;
      if (local_a8.object == (SourceCodeText *)0x0) {
        o.object = (SourceCodeText *)0x0;
      }
      else {
        (__return_storage_ptr__->fileComment).range.end.sourceCode.object = local_a8.object;
        local_a8.object = (SourceCodeText *)0x0;
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
        o.object = local_a8.object;
      }
      (__return_storage_ptr__->fileComment).range.end.location.data = local_a0.data;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o.object);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_b8.data);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_d8 + 8));
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_88._0_8_);
      return __return_storage_ptr__;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)paVar9 + 1);
    UVar8 = UTF8Reader::getAndAdvance((UTF8Reader *)&local_48);
  } while (UVar8 == bVar1);
  throwInternalCompilerError
            ("d.moduleKeyword.location.startsWith (d.getType().c_str())","createDecl",0x72);
}

Assistant:

SourceCodeOperations::ModuleDeclaration SourceCodeOperations::createDecl (AST::ModuleBase& m)
{
    ModuleDeclaration d { m, allocator };

    d.moduleKeyword = m.processorKeywordLocation;
    SOUL_ASSERT (d.moduleKeyword.location.startsWith (d.getType().c_str()));

    d.startIncludingPreamble = SourceCodeUtilities::findStartOfPrecedingComment (d.moduleKeyword);
    d.openBrace = SimpleTokeniser::findNext (d.moduleKeyword, Operator::openBrace);
    d.endOfClosingBrace = SourceCodeUtilities::findEndOfMatchingBrace (d.openBrace);
    d.fileComment = SourceCodeUtilities::parseComment (d.startIncludingPreamble);
    return d;
}